

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_atomic_test.c
# Opt level: O3

int main(void)

{
  hdr_histogram *phVar1;
  _Bool _Var2;
  int iVar3;
  int64_t iVar4;
  char *pcVar5;
  char *pcVar6;
  hdr_histogram *h;
  hdr_histogram *local_18;
  
  local_18 = (hdr_histogram *)0x0;
  iVar3 = hdr_init(1,3600000000,3,&local_18);
  pcVar5 = "Failed to allocate hdr_histogram";
  if ((iVar3 == 0) && (local_18 != (hdr_histogram *)0x0)) {
    _Var2 = compare_int64((long)local_18->counts_len,0x5c00);
    if (!_Var2) {
      pcVar5 = "Incorrect array length";
      goto LAB_00101299;
    }
    free(local_18);
    tests_run = tests_run + 1;
    local_18 = (hdr_histogram *)0x0;
    iVar3 = hdr_init(0,0x10000,2,&local_18);
    if (iVar3 != 0x16) {
      pcVar5 = "Should not allow 0 as lowest trackable value";
LAB_00101399:
      pcVar6 = "test_invalid_init";
      goto LAB_001012a0;
    }
    iVar3 = hdr_init(0x50,0x6e,5,&local_18);
    if (iVar3 != 0x16) {
      pcVar5 = "Should have lowest < 2 * highest";
      goto LAB_00101399;
    }
    tests_run = tests_run + 1;
    local_18 = (hdr_histogram *)0x0;
    iVar3 = hdr_init(20000000,100000000,5,&local_18);
    if (iVar3 != 0) {
      pcVar5 = "Didn\'t create";
LAB_001014d7:
      pcVar6 = "test_create_with_large_values";
      goto LAB_001012a0;
    }
    hdr_record_value_atomic(local_18,100000000);
    hdr_record_value_atomic(local_18,20000000);
    hdr_record_value_atomic(local_18,30000000);
    phVar1 = local_18;
    iVar4 = hdr_value_at_percentile(local_18,50.0);
    _Var2 = hdr_values_are_equivalent(phVar1,20000000,iVar4);
    phVar1 = local_18;
    if (!_Var2) {
      pcVar5 = "50.0% Percentile";
      goto LAB_001014d7;
    }
    iVar4 = hdr_value_at_percentile(local_18,83.33);
    _Var2 = hdr_values_are_equivalent(phVar1,30000000,iVar4);
    phVar1 = local_18;
    if (!_Var2) {
      pcVar5 = "83.33% Percentile";
      goto LAB_001014d7;
    }
    iVar4 = hdr_value_at_percentile(local_18,83.34);
    _Var2 = hdr_values_are_equivalent(phVar1,100000000,iVar4);
    phVar1 = local_18;
    if (!_Var2) {
      pcVar5 = "83.34% Percentile";
      goto LAB_001014d7;
    }
    iVar4 = hdr_value_at_percentile(local_18,99.0);
    _Var2 = hdr_values_are_equivalent(phVar1,100000000,iVar4);
    if (!_Var2) {
      pcVar5 = "99.0% Percentile";
      goto LAB_001014d7;
    }
    tests_run = tests_run + 1;
    local_18 = (hdr_histogram *)0x0;
    iVar3 = hdr_alloc(36000000,-1,&local_18);
    pcVar5 = "Result was not EINVAL";
    if (iVar3 != 0x16) {
LAB_00101504:
      pcVar6 = "test_invalid_significant_figures";
      goto LAB_001012a0;
    }
    if (local_18 != (hdr_histogram *)0x0) {
      pcVar5 = "Histogram was not null";
      goto LAB_00101504;
    }
    iVar3 = hdr_alloc(36000000,6,&local_18);
    if ((iVar3 != 0x16) || (pcVar5 = "Histogram was not null", local_18 != (hdr_histogram *)0x0))
    goto LAB_00101504;
    tests_run = tests_run + 1;
    load_histograms();
    pcVar6 = "test_total_count";
    if (raw_histogram->total_count != 0x2711) {
      pcVar5 = "Total raw count != 10001";
      goto LAB_001012a0;
    }
    if (cor_histogram->total_count != 20000) {
      pcVar5 = "Total corrected count != 20000";
      goto LAB_001012a0;
    }
    tests_run = tests_run + 1;
    load_histograms();
    iVar4 = hdr_min(raw_histogram);
    pcVar6 = "test_get_min_value";
    if (iVar4 != 1000) {
      pcVar5 = "hdr_min(raw_histogram) != 1000";
      goto LAB_001012a0;
    }
    iVar4 = hdr_min(cor_histogram);
    if (iVar4 != 1000) {
      pcVar5 = "hdr_min(cor_histogram) != 1000";
      goto LAB_001012a0;
    }
    tests_run = tests_run + 1;
    pcVar5 = test_get_max_value();
    tests_run = tests_run + 1;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = test_percentiles();
      tests_run = tests_run + 1;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = test_recorded_values();
        tests_run = tests_run + 1;
        if (pcVar5 == (char *)0x0) {
          pcVar5 = test_linear_values();
          tests_run = tests_run + 1;
          if (pcVar5 == (char *)0x0) {
            pcVar5 = test_logarithmic_values();
            tests_run = tests_run + 1;
            if (pcVar5 == (char *)0x0) {
              pcVar5 = test_reset();
              tests_run = tests_run + 1;
              if (pcVar5 == (char *)0x0) {
                pcVar5 = test_scaling_equivalence();
                tests_run = tests_run + 1;
                if (pcVar5 == (char *)0x0) {
                  pcVar5 = test_out_of_range_values();
                  tests_run = tests_run + 1;
                  if (pcVar5 == (char *)0x0) {
                    pcVar5 = test_linear_iter_buckets_correctly();
                    tests_run = tests_run + 1;
                    if (pcVar5 == (char *)0x0) {
                      pcVar5 = test_interval_recording();
                      tests_run = tests_run + 1;
                      if (pcVar5 == (char *)0x0) {
                        puts("ALL TESTS PASSED");
                        iVar3 = 0;
                        goto LAB_001012bf;
                      }
                      pcVar6 = "test_interval_recording";
                    }
                    else {
                      pcVar6 = "test_linear_iter_buckets_correctly";
                    }
                  }
                  else {
                    pcVar6 = "test_out_of_range_values";
                  }
                }
                else {
                  pcVar6 = "test_scaling_equivalence";
                }
              }
              else {
                pcVar6 = "test_reset";
              }
            }
            else {
              pcVar6 = "test_logarithmic_values";
            }
          }
          else {
            pcVar6 = "test_linear_values";
          }
        }
        else {
          pcVar6 = "test_recorded_values";
        }
      }
      else {
        pcVar6 = "test_percentiles";
      }
    }
    else {
      pcVar6 = "test_get_max_value";
    }
  }
  else {
LAB_00101299:
    pcVar6 = "test_create";
LAB_001012a0:
    tests_run = tests_run + 1;
  }
  printf("hdr_histogram_test.%s(): %s\n",pcVar6,pcVar5);
  iVar3 = -1;
LAB_001012bf:
  printf("Tests run: %d\n",(ulong)(uint)tests_run);
  return iVar3;
}

Assistant:

int main(void)
{
    return hdr_histogram_run_tests();
}